

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Match.cpp
# Opt level: O2

void __thiscall xercesc_4_0::Match::initialize(Match *this,Match *toCopy)

{
  int n;
  int iVar1;
  int index;
  
  this->fMemoryManager = toCopy->fMemoryManager;
  n = getNoGroups(toCopy);
  setNoGroups(this,n);
  index = 0;
  if (n < 1) {
    n = index;
  }
  for (; n != index; index = index + 1) {
    iVar1 = getStartPos(toCopy,index);
    setStartPos(this,index,iVar1);
    iVar1 = getEndPos(toCopy,index);
    setEndPos(this,index,iVar1);
  }
  return;
}

Assistant:

void Match::initialize(const Match &toCopy){

  //do not copy over value of fPositionSize as it is irrelevant to the 
  //state of the Match

  fMemoryManager = toCopy.fMemoryManager;
  int toCopySize = toCopy.getNoGroups();
  setNoGroups(toCopySize);

  for (int i=0; i<toCopySize; i++){
    setStartPos(i, toCopy.getStartPos(i));
    setEndPos(i, toCopy.getEndPos(i));
  }           

}